

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

uchar __thiscall RegVmLoweredFunction::GetRegisterForConstant(RegVmLoweredFunction *this)

{
  uchar local_11;
  RegVmLoweredFunction *pRStack_10;
  uchar result;
  RegVmLoweredFunction *this_local;
  
  pRStack_10 = this;
  local_11 = GetRegister(this);
  SmallArray<unsigned_char,_16U>::push_back(&this->constantRegisters,&local_11);
  return local_11;
}

Assistant:

unsigned char RegVmLoweredFunction::GetRegisterForConstant()
{
	unsigned char result = GetRegister();

	constantRegisters.push_back(result);

	return result;
}